

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qjsondocument.cpp
# Opt level: O1

QJsonValue * __thiscall
QJsonDocument::operator[](QJsonValue *__return_storage_ptr__,QJsonDocument *this,QStringView key)

{
  _Head_base<0UL,_QJsonDocumentPrivate_*,_false> _Var1;
  QJsonValue *result;
  long in_FS_OFFSET;
  QCborMap QStack_58;
  QCborValue local_50;
  QCborValue local_38;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  _Var1._M_head_impl =
       (this->d)._M_t.
       super___uniq_ptr_impl<QJsonDocumentPrivate,_std::default_delete<QJsonDocumentPrivate>_>._M_t.
       super__Tuple_impl<0UL,_QJsonDocumentPrivate_*,_std::default_delete<QJsonDocumentPrivate>_>.
       super__Head_base<0UL,_QJsonDocumentPrivate_*,_false>._M_head_impl;
  if ((_Var1._M_head_impl == (QJsonDocumentPrivate *)0x0) ||
     (*(Type *)((long)&(_Var1._M_head_impl)->value + 0x10) != Map)) {
    if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
      QJsonValue::QJsonValue(__return_storage_ptr__,Undefined);
      return __return_storage_ptr__;
    }
  }
  else {
    QCborValue::toMap((QCborValue *)&QStack_58);
    QCborValue::QCborValue((QCborValue *)&local_50,key);
    QCborMap::value(&local_38,&QStack_58,&local_50);
    *(undefined1 **)&(__return_storage_ptr__->value).t = &DAT_aaaaaaaaaaaaaaaa;
    (__return_storage_ptr__->value).n = (qint64)&DAT_aaaaaaaaaaaaaaaa;
    (__return_storage_ptr__->value).container = (QCborContainerPrivate *)&DAT_aaaaaaaaaaaaaaaa;
    QJsonValue::QJsonValue(__return_storage_ptr__,Null);
    QCborValue::operator=((QCborValue *)__return_storage_ptr__,&local_38);
    QCborValue::~QCborValue((QCborValue *)&local_38);
    QCborValue::~QCborValue((QCborValue *)&local_50);
    QCborMap::~QCborMap(&QStack_58);
    if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
      return __return_storage_ptr__;
    }
  }
  __stack_chk_fail();
}

Assistant:

const QJsonValue QJsonDocument::operator[](QStringView key) const
{
    if (!isObject())
        return QJsonValue(QJsonValue::Undefined);

    return QJsonPrivate::Value::fromTrustedCbor(d->value.toMap().value(key));
}